

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rbuFossilDeltaFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  int lenDelta;
  int n;
  char *zSrc;
  char *zDelta;
  char *zOut;
  char *aOut;
  int nOut2;
  int nOut;
  int nOrig;
  char *aOrig;
  int nDelta;
  char *aDelta;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  iVar1 = sqlite3_value_bytes(*argv);
  zSrc = (char *)sqlite3_value_blob(*argv);
  lenDelta = sqlite3_value_bytes(argv[1]);
  zDelta = (char *)sqlite3_value_blob(argv[1]);
  n = rbuDeltaOutputSize(zDelta,lenDelta);
  if (n < 0) {
    sqlite3_result_error(context,"corrupt fossil delta",-1);
  }
  else {
    zOut = (char *)sqlite3_malloc(n + 1);
    if (zOut == (char *)0x0) {
      sqlite3_result_error_nomem(context);
    }
    else {
      iVar1 = rbuDeltaApply(zSrc,iVar1,zDelta,lenDelta,zOut);
      if (iVar1 == n) {
        sqlite3_result_blob(context,zOut,n,sqlite3_free);
      }
      else {
        sqlite3_free(zOut);
        sqlite3_result_error(context,"corrupt fossil delta",-1);
      }
    }
  }
  return;
}

Assistant:

static void rbuFossilDeltaFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const char *aDelta;
  int nDelta;
  const char *aOrig;
  int nOrig;

  int nOut;
  int nOut2;
  char *aOut;

  assert( argc==2 );

  nOrig = sqlite3_value_bytes(argv[0]);
  aOrig = (const char*)sqlite3_value_blob(argv[0]);
  nDelta = sqlite3_value_bytes(argv[1]);
  aDelta = (const char*)sqlite3_value_blob(argv[1]);

  /* Figure out the size of the output */
  nOut = rbuDeltaOutputSize(aDelta, nDelta);
  if( nOut<0 ){
    sqlite3_result_error(context, "corrupt fossil delta", -1);
    return;
  }

  aOut = sqlite3_malloc(nOut+1);
  if( aOut==0 ){
    sqlite3_result_error_nomem(context);
  }else{
    nOut2 = rbuDeltaApply(aOrig, nOrig, aDelta, nDelta, aOut);
    if( nOut2!=nOut ){
      sqlite3_free(aOut);
      sqlite3_result_error(context, "corrupt fossil delta", -1);
    }else{
      sqlite3_result_blob(context, aOut, nOut, sqlite3_free);
    }
  }
}